

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExpressionStatement(SyntaxDumper *this,ExpressionStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  ExpressionStatementSyntax local_50 [56];
  ExpressionStatementSyntax *local_18;
  ExpressionStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExpressionStatementSyntax *)this;
  pEVar1 = ExpressionStatementSyntax::expression(node);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  ExpressionStatementSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitExpressionStatement(const ExpressionStatementSyntax* node) override
    {
        nonterminal(node->expression());
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }